

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

char * __thiscall
google::protobuf::EnumOptions::_InternalParse(EnumOptions *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  byte bVar1;
  int iVar2;
  bool bVar3;
  byte *pbVar4;
  UninterpretedOption *msg;
  ulong uVar5;
  Rep *pRVar6;
  char cVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  UnknownFieldSet *unknown;
  byte *pbVar11;
  uint uVar12;
  pair<const_char_*,_unsigned_int> pVar13;
  pair<const_char_*,_unsigned_long> pVar14;
  byte *local_38;
  
  local_38 = (byte *)ptr;
  bVar3 = internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
  uVar12 = 0;
  if (!bVar3) {
    this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
    uVar12 = 0;
    do {
      bVar1 = *local_38;
      uVar5 = (ulong)bVar1;
      pbVar11 = local_38 + 1;
      if ((char)bVar1 < '\0') {
        uVar8 = ((uint)bVar1 + (uint)*pbVar11 * 0x80) - 0x80;
        uVar5 = (ulong)uVar8;
        if (-1 < (char)*pbVar11) {
          pbVar11 = local_38 + 2;
          goto LAB_002a2f28;
        }
        pVar13 = internal::ReadTagFallback((char *)local_38,uVar8);
        local_38 = (byte *)pVar13.first;
        if (local_38 != (byte *)0x0) goto LAB_002a2f2c;
LAB_002a3175:
        local_38 = (byte *)0x0;
        break;
      }
LAB_002a2f28:
      pVar13._8_8_ = uVar5;
      pVar13.first = (char *)pbVar11;
      local_38 = pbVar11;
LAB_002a2f2c:
      pbVar11 = (byte *)pVar13.first;
      uVar9 = pVar13.second;
      uVar8 = (uint)(pVar13._8_8_ >> 3) & 0x1fffffff;
      cVar7 = (char)pVar13.second;
      if (uVar8 == 999) {
        if (cVar7 != ':') goto LAB_002a308d;
        local_38 = pbVar11 + -2;
        do {
          local_38 = local_38 + 2;
          pRVar6 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar6 == (Rep *)0x0) {
            iVar10 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_;
LAB_002a3002:
            internal::RepeatedPtrFieldBase::Reserve
                      (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,iVar10 + 1);
            pRVar6 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
            iVar10 = pRVar6->allocated_size;
LAB_002a3013:
            pRVar6->allocated_size = iVar10 + 1;
            msg = Arena::CreateMaybeMessage<google::protobuf::UninterpretedOption>
                            ((this->uninterpreted_option_).super_RepeatedPtrFieldBase.arena_);
            pRVar6 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
            iVar10 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
            (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar10 + 1;
            pRVar6->elements[iVar10] = msg;
          }
          else {
            iVar2 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
            iVar10 = pRVar6->allocated_size;
            if (iVar10 <= iVar2) {
              if (iVar10 == (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_002a3002;
              goto LAB_002a3013;
            }
            (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            msg = (UninterpretedOption *)pRVar6->elements[iVar2];
          }
          local_38 = (byte *)internal::ParseContext::
                             ParseMessage<google::protobuf::UninterpretedOption>
                                       (ctx,msg,(char *)local_38);
          if (local_38 == (byte *)0x0) goto LAB_002a3175;
        } while ((local_38 < (ctx->super_EpsCopyInputStream).limit_end_) &&
                (*(short *)local_38 == 0x3eba));
      }
      else {
        if (uVar8 == 3) {
          if (cVar7 == '\x18') {
            uVar12 = uVar12 | 2;
            uVar5 = (ulong)(char)*pbVar11;
            pbVar4 = pbVar11 + 1;
            if ((long)uVar5 < 0) {
              uVar8 = ((uint)*pbVar4 * 0x80 + (uint)*pbVar11) - 0x80;
              if ((char)*pbVar4 < '\0') {
                pVar14 = internal::VarintParseSlow64((char *)pbVar11,uVar8);
                local_38 = (byte *)pVar14.first;
                this->deprecated_ = pVar14.second != 0;
                goto LAB_002a310d;
              }
              uVar5 = (ulong)uVar8;
              pbVar4 = pbVar11 + 2;
            }
            this->deprecated_ = uVar5 != 0;
            local_38 = pbVar4;
            goto LAB_002a3112;
          }
LAB_002a308d:
          if ((uVar9 == 0) || ((uVar9 & 7) == 4)) {
            (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar9 - 1;
            break;
          }
          uVar5 = pVar13._8_8_ & 0xffffffff;
          if (uVar9 < 8000) {
            if (((ulong)this_00->ptr_ & 1) == 0) {
              unknown = internal::InternalMetadata::
                        mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this_00);
              pbVar11 = local_38;
            }
            else {
              unknown = (UnknownFieldSet *)(((ulong)this_00->ptr_ & 0xfffffffffffffffe) + 8);
            }
            local_38 = (byte *)internal::UnknownFieldParse(uVar5,unknown,(char *)pbVar11,ctx);
          }
          else {
            local_38 = (byte *)internal::ExtensionSet::ParseField
                                         (&this->_extensions_,uVar5,(char *)pbVar11,
                                          (Message *)_EnumOptions_default_instance_,this_00,ctx);
          }
        }
        else {
          if ((uVar8 != 2) || (cVar7 != '\x10')) goto LAB_002a308d;
          uVar12 = uVar12 | 1;
          uVar5 = (ulong)(char)*pbVar11;
          pbVar4 = pbVar11 + 1;
          if (-1 < (long)uVar5) {
LAB_002a2f86:
            this->allow_alias_ = uVar5 != 0;
            local_38 = pbVar4;
            goto LAB_002a3112;
          }
          uVar8 = ((uint)*pbVar4 * 0x80 + (uint)*pbVar11) - 0x80;
          if (-1 < (char)*pbVar4) {
            uVar5 = (ulong)uVar8;
            pbVar4 = pbVar11 + 2;
            goto LAB_002a2f86;
          }
          pVar14 = internal::VarintParseSlow64((char *)pbVar11,uVar8);
          local_38 = (byte *)pVar14.first;
          this->allow_alias_ = pVar14.second != 0;
        }
LAB_002a310d:
        if (local_38 == (byte *)0x0) goto LAB_002a3175;
      }
LAB_002a3112:
      bVar3 = internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    } while (!bVar3);
  }
  (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar12;
  return (char *)local_38;
}

Assistant:

const char* EnumOptions::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArena(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional bool allow_alias = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16)) {
          _Internal::set_has_allow_alias(&has_bits);
          allow_alias_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool deprecated = 3 [default = false];
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 24)) {
          _Internal::set_has_deprecated(&has_bits);
          deprecated_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr -= 2;
          do {
            ptr += 2;
            ptr = ctx->ParseMessage(_internal_add_uninterpreted_option(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<7994>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
      if ((8000u <= tag)) {
        ptr = _extensions_.ParseField(tag, ptr,
            internal_default_instance(), &_internal_metadata_, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}